

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O2

void __thiscall camp::OutOfRange::OutOfRange(OutOfRange *this,size_t index,size_t size)

{
  _Alloc_hider in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  Error::str<unsigned_long>((unsigned_long)in_stack_ffffffffffffff28._M_p);
  std::operator+(&local_b8,"the index (",&local_38);
  std::operator+(&local_98,&local_b8,") is out of the allowed range [0, ");
  Error::str<unsigned_long>((unsigned_long)in_stack_ffffffffffffff28._M_p);
  std::operator+(&local_78,&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffff28);
  std::operator+(&local_58,&local_78,"]");
  Error::Error(&this->super_Error,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_38);
  *(undefined ***)&this->super_Error = &PTR__Error_00141238;
  return;
}

Assistant:

OutOfRange::OutOfRange(std::size_t index, std::size_t size)
    : Error("the index (" + str(index) + ") is out of the allowed range [0, " + str(size - 1) + "]")
{
}